

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_lite.cc
# Opt level: O1

char * google::protobuf::internal::TcParser::FastUR1
                 (MessageLite *msg,char *ptr,ParseContext *ctx,TcFieldData data,
                 TcParseTableBase *table,uint64_t hasbits)

{
  unsigned_long v1;
  byte bVar1;
  byte bVar2;
  ushort uVar3;
  SerialArena *this;
  __int_type_conflict _Var4;
  __pointer_type pSVar5;
  int iVar6;
  uint uVar7;
  Rep *pRVar8;
  Value<google::protobuf::internal::GenericTypeHandler<std::string>_> *pVVar9;
  Nonnull<const_char_*> failure_msg;
  string *s;
  ulong uVar10;
  char *pcVar11;
  long extraout_RDX;
  long lVar12;
  ParseContext *extraout_RDX_00;
  ParseContext *ctx_00;
  long extraout_RDX_01;
  ParseContext *extraout_RDX_02;
  ParseContext *extraout_RDX_03;
  TcParseTableBase *pTVar13;
  unsigned_long v2;
  uint *puVar14;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 *this_00;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 unaff_R13;
  TcParseTableBase *ptr_00;
  long in_FS_OFFSET;
  pair<const_char_*,_int> pVar15;
  LogMessageFatal local_40;
  
  if (data.field_0._0_1_ != '\0') {
    pcVar11 = MiniParse(msg,ptr,ctx,data,table,hasbits);
    return pcVar11;
  }
  this_00 = (anon_union_8_1_898a9ca8_for_TcFieldData_0 *)
            ((long)&msg->_vptr_MessageLite + ((ulong)data.field_0 >> 0x30));
  if (((ulong)this_00 & 7) != 0) {
    AlignFail(this_00);
  }
  bVar1 = *ptr;
  if ((long *)this_00[2].data == (long *)0x0) {
LAB_0021e299:
    do {
      ptr_00 = (TcParseTableBase *)((long)ptr + 1);
      s = (string *)RepeatedPtrFieldBase::AddString((RepeatedPtrFieldBase *)this_00);
      ptr = InlineGreedyStringParser(s,(char *)ptr_00,ctx);
      ctx_00 = extraout_RDX_02;
      if ((ushort *)ptr == (ushort *)0x0) goto LAB_0021e383;
      pVVar9 = RepeatedPtrFieldBase::
               Mutable<google::protobuf::internal::GenericTypeHandler<std::__cxx11::string>>
                         ((RepeatedPtrFieldBase *)this_00,*(int *)(this_00 + 1) + -1);
      iVar6 = utf8_range_IsValid((pVVar9->_M_dataplus)._M_p,pVVar9->_M_string_length);
      if (iVar6 == 0) goto LAB_0021e375;
      if ((ctx->super_EpsCopyInputStream).limit_end_ <= ptr) goto LAB_0021e2e7;
    } while ((byte)*(ushort *)ptr == bVar1);
  }
  else {
    data.field_0.data = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0xffffffffffffff80;
    lVar12 = *(long *)(in_FS_OFFSET + -0x78);
    if (lVar12 != *(long *)this_00[2].data) goto LAB_0021e299;
    this = *(SerialArena **)(in_FS_OFFSET + -0x70);
    data.field_0 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)this_00->data;
    pTVar13 = (TcParseTableBase *)ptr;
    if (((ulong)data.field_0 & 1) == 0) {
      uVar7 = (uint)(data.field_0.data != (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x0);
    }
    else {
      pRVar8 = RepeatedPtrFieldBase::rep((RepeatedPtrFieldBase *)this_00);
      uVar7 = pRVar8->allocated_size;
      lVar12 = extraout_RDX;
    }
    if (uVar7 != *(uint *)(this_00 + 1)) goto LAB_0021e299;
    do {
      bVar2 = *(byte *)((long)ptr + 1);
      ptr_00 = (TcParseTableBase *)(ulong)bVar2;
      uVar7 = (uint)bVar2;
      if ((char)bVar2 < '\0') {
        pVar15 = ReadSizeFallback((char *)((long)ptr + 1),(uint)bVar2);
        uVar7 = pVar15.second;
      }
      else {
        pVar15._8_8_ = lVar12;
        pVar15.first = (char *)((long)ptr + 2);
        ptr_00 = pTVar13;
      }
      ctx_00 = pVar15._8_8_;
      pTVar13 = (TcParseTableBase *)pVar15.first;
      if (pTVar13 == (TcParseTableBase *)0x0) {
        ptr = (char *)0x0;
      }
      else {
        _Var4 = (this->string_block_unused_).super___atomic_base<unsigned_long>._M_i;
        if (_Var4 != 0) {
          v1 = _Var4 - 0x20;
          (this->string_block_unused_).super___atomic_base<unsigned_long>._M_i = v1;
          pSVar5 = (this->string_block_)._M_b._M_p;
          v2 = (ulong)pSVar5->allocated_size_ - 0x10;
          if (v2 < v1) {
            failure_msg = absl::lts_20250127::log_internal::
                          MakeCheckOpString<unsigned_long,unsigned_long>
                                    (v1,v2,"offset <= effective_size()");
          }
          else {
            failure_msg = (Nonnull<const_char_*>)0x0;
          }
          if (failure_msg != (Nonnull<const_char_*>)0x0) {
            absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                      (&local_40,
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/string_block.h"
                       ,0xa2,failure_msg);
            absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal(&local_40);
          }
          unaff_R13.data = (long)&pSVar5[-1].next_ + _Var4;
        }
        data.field_0 = unaff_R13;
        if (_Var4 == 0) {
          data.field_0 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)
                         SerialArena::AllocateFromStringBlockFallback(this);
        }
        *(uint64_t *)data.field_0 = (long)data.field_0 + 0x10;
        *(undefined8 *)((long)data.field_0 + 8) = 0;
        *(undefined1 *)((long)data.field_0 + 0x10) = 0;
        RepeatedPtrFieldBase::AddAllocatedForParse
                  ((RepeatedPtrFieldBase *)this_00,(void *)data.field_0);
        ptr = EpsCopyInputStream::ReadString
                        (&ctx->super_EpsCopyInputStream,(char *)pTVar13,uVar7,(string *)data.field_0
                        );
        ctx_00 = extraout_RDX_00;
        ptr_00 = pTVar13;
      }
      if ((ushort *)ptr == (ushort *)0x0) goto LAB_0021e383;
      pVVar9 = RepeatedPtrFieldBase::
               Mutable<google::protobuf::internal::GenericTypeHandler<std::__cxx11::string>>
                         ((RepeatedPtrFieldBase *)this_00,*(int *)(this_00 + 1) + -1);
      pTVar13 = (TcParseTableBase *)pVVar9->_M_string_length;
      iVar6 = utf8_range_IsValid((pVVar9->_M_dataplus)._M_p,(size_t)pTVar13);
      if (iVar6 == 0) goto LAB_0021e375;
      if ((ctx->super_EpsCopyInputStream).limit_end_ <= ptr) goto LAB_0021e2e7;
      lVar12 = extraout_RDX_01;
    } while ((byte)*(ushort *)ptr == bVar1);
  }
  if (ptr < (ctx->super_EpsCopyInputStream).limit_end_) {
    uVar7 = (uint)table->fast_idx_mask & (uint)*(ushort *)ptr;
    if ((uVar7 & 7) == 0) {
      uVar10 = (ulong)(uVar7 & 0xfffffff8);
      pcVar11 = (char *)(**(code **)(&table[1].has_bits_offset + uVar10))
                                  (msg,ptr,ctx,
                                   (ulong)*(ushort *)ptr ^
                                   *(ulong *)(&table[1].fast_idx_mask + uVar10 * 2),table,hasbits);
      return pcVar11;
    }
    protobuf_assumption_failed
              ("(idx & 7) == 0",
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_impl.h"
               ,0x452);
  }
  uVar3 = table->has_bits_offset;
joined_r0x0021e2f7:
  if ((ulong)uVar3 != 0) {
    puVar14 = (uint *)((long)&msg->_vptr_MessageLite + (ulong)uVar3);
    if (((ulong)puVar14 & 3) != 0) {
      AlignFail();
    }
    *puVar14 = *puVar14 | (uint)hasbits;
  }
  return (char *)(ushort *)ptr;
LAB_0021e2e7:
  uVar3 = table->has_bits_offset;
  goto joined_r0x0021e2f7;
LAB_0021e375:
  ptr_00 = table;
  ReportFastUtf8Error((uint)bVar1,table);
  ctx_00 = extraout_RDX_03;
LAB_0021e383:
  pcVar11 = Error(msg,(char *)ptr_00,ctx_00,data,table,hasbits);
  return pcVar11;
}

Assistant:

PROTOBUF_NOINLINE const char* TcParser::FastUR1(PROTOBUF_TC_PARAM_DECL) {
  PROTOBUF_MUSTTAIL return RepeatedString<uint8_t,
                                          RepeatedPtrField<std::string>, kUtf8>(
      PROTOBUF_TC_PARAM_PASS);
}